

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cpp
# Opt level: O1

bool iDynTree::CompositeRigidBodyAlgorithm
               (Model *model,Traversal *traversal,JointPosDoubleArray *jointPos,
               LinkCompositeRigidBodyInertias *linkCRBs,FreeFloatingMassMatrix *massMatrix)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  Link *pLVar10;
  LinkIndex LVar11;
  SpatialInertia *pSVar12;
  SpatialInertia *pSVar13;
  Link *this;
  IJoint *pIVar14;
  LinkIndex LVar15;
  undefined4 extraout_var;
  LinkIndex LVar16;
  undefined4 extraout_var_00;
  double *pdVar17;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined8 *puVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  SpatialForceVector F;
  Matrix6x6 lockedInertia;
  SpatialMotionVector S_visitedDof;
  undefined1 local_220 [40];
  double local_1f8;
  double dStack_1f0;
  double adStack_1d8 [4];
  SpatialInertia local_1b8 [2];
  Transform local_98 [8];
  double local_90;
  double dStack_88;
  double local_80;
  double dStack_78;
  double local_70;
  double dStack_68;
  GeomVector3 local_60;
  GeomVector3 local_48;
  
  lVar8 = iDynTree::MatrixDynSize::data();
  iDynTree::MatrixDynSize::rows();
  lVar9 = iDynTree::MatrixDynSize::cols();
  uVar6 = Traversal::getNrOfVisitedLinks(traversal);
  if (uVar6 != 0) {
    uVar19 = 0;
    do {
      pLVar10 = Traversal::getLink(traversal,uVar19);
      LVar11 = Link::getIndex(pLVar10);
      pSVar12 = Link::getInertia(pLVar10);
      pSVar13 = LinkInertias::operator()(linkCRBs,LVar11);
      dVar2 = pSVar12->m_mcom[0];
      dVar3 = pSVar12->m_mcom[1];
      dVar4 = pSVar12->m_mcom[2];
      pSVar13->m_mass = pSVar12->m_mass;
      pSVar13->m_mcom[0] = dVar2;
      pSVar13->m_mcom[1] = dVar3;
      pSVar13->m_mcom[2] = dVar4;
      iDynTree::RotationalInertia::operator=(&pSVar13->m_rotInertia,&pSVar12->m_rotInertia);
      uVar19 = uVar19 + 1;
      uVar6 = Traversal::getNrOfVisitedLinks(traversal);
    } while (uVar19 < uVar6);
  }
  uVar6 = Traversal::getNrOfVisitedLinks(traversal);
  if (-1 < (int)(uVar6 - 1)) {
    uVar19 = (ulong)(uVar6 - 1);
    do {
      this = Traversal::getLink(traversal,uVar19);
      LVar11 = Link::getIndex(this);
      pLVar10 = Traversal::getParentLink(traversal,uVar19);
      pIVar14 = Traversal::getParentJoint(traversal,uVar19);
      if (pLVar10 != (Link *)0x0) {
        LVar15 = Link::getIndex(pLVar10);
        pSVar12 = LinkInertias::operator()(linkCRBs,LVar15);
        iVar7 = (*pIVar14->_vptr_IJoint[10])(pIVar14,jointPos,LVar15,LVar11);
        LinkInertias::operator()(linkCRBs,LVar11);
        iDynTree::Transform::operator*
                  ((Transform *)local_220,(SpatialInertia *)CONCAT44(extraout_var,iVar7));
        iDynTree::SpatialInertia::operator+(local_1b8,pSVar12);
        pSVar12 = LinkInertias::operator()(linkCRBs,LVar15);
        pSVar12->m_mass = local_1b8[0].m_mass;
        pSVar12->m_mcom[0] = local_1b8[0].m_mcom[0];
        pSVar12->m_mcom[1] = local_1b8[0].m_mcom[1];
        pSVar12->m_mcom[2] = local_1b8[0].m_mcom[2];
        iDynTree::RotationalInertia::operator=(&pSVar12->m_rotInertia,&local_1b8[0].m_rotInertia);
        iVar7 = (*pIVar14->_vptr_IJoint[4])(pIVar14);
        if (iVar7 == 1) {
          LVar16 = Link::getIndex(this);
          (*pIVar14->_vptr_IJoint[0xc])(&local_60,pIVar14,0,LVar16,LVar15);
          pSVar12 = LinkInertias::operator()(linkCRBs,LVar11);
          iDynTree::SpatialInertia::operator*
                    ((SpatialInertia *)local_220,(SpatialMotionVector *)pSVar12);
          iVar7 = (*pIVar14->_vptr_IJoint[0x18])(pIVar14);
          dVar2 = (double)iDynTree::GeomVector3::dot(&local_60);
          dVar3 = (double)iDynTree::GeomVector3::dot(&local_48);
          uVar20 = CONCAT44(extraout_var_00,iVar7) + 6;
          pdVar17 = (double *)iDynTree::MatrixDynSize::operator()((ulong)massMatrix,uVar20);
          dVar2 = dVar2 + dVar3;
          do {
            *pdVar17 = dVar2;
            do {
              LVar11 = Link::getIndex(this);
              pLVar10 = Traversal::getParentLinkFromLinkIndex(traversal,LVar11);
              LVar11 = Link::getIndex(pLVar10);
              pLVar10 = Traversal::getParentLinkFromLinkIndex(traversal,LVar11);
              if (pLVar10 == (Link *)0x0) {
                LVar11 = Link::getIndex(this);
                pIVar14 = Traversal::getParentJointFromLinkIndex(traversal,LVar11);
                LVar11 = Link::getIndex(this);
                pLVar10 = Traversal::getParentLinkFromLinkIndex(traversal,LVar11);
                LVar11 = Link::getIndex(pLVar10);
                LVar15 = Link::getIndex(this);
                iVar7 = (*pIVar14->_vptr_IJoint[10])(pIVar14,jointPos,LVar11,LVar15);
                iDynTree::Transform::Transform
                          ((Transform *)local_1b8,(Transform *)CONCAT44(extraout_var_03,iVar7));
                iDynTree::Transform::operator*(local_98,(SpatialForceVector *)local_1b8);
                local_1f8 = local_70;
                dStack_1f0 = dStack_68;
                local_220._24_8_ = local_80;
                local_220._32_8_ = dStack_78;
                local_220._8_8_ = local_90;
                local_220._16_8_ = dStack_88;
                iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_98);
                local_1b8[0].m_mass = (double)local_220._24_8_;
                local_1b8[0].m_mcom[0] = (double)local_220._32_8_;
                local_1b8[0].m_mcom[1] = local_1f8;
                local_1b8[0].m_mcom[2] = dStack_1f0;
                lVar21 = lVar8 + uVar20 * 8;
                *(undefined8 *)(lVar8 + uVar20 * 8) = local_220._8_8_;
                *(undefined8 *)(lVar21 + lVar9 * 8) = local_220._16_8_;
                *(undefined8 *)(lVar9 * 0x10 + lVar21) = local_220._24_8_;
                *(undefined8 *)(lVar9 * 0x18 + lVar21) = local_220._32_8_;
                *(double *)(lVar9 * 0x20 + lVar21) = local_1f8;
                *(double *)(lVar9 * 0x28 + lVar21) = dStack_1f0;
                lVar21 = uVar20 * lVar9;
                pdVar17 = (double *)(lVar8 + lVar21 * 8);
                *pdVar17 = (double)local_220._8_8_;
                pdVar17[1] = (double)local_220._16_8_;
                pdVar17 = (double *)(lVar8 + 0x10 + lVar21 * 8);
                *pdVar17 = (double)local_220._24_8_;
                pdVar17[1] = (double)local_220._32_8_;
                pdVar17 = (double *)(lVar8 + 0x20 + lVar21 * 8);
                *pdVar17 = local_1f8;
                pdVar17[1] = dStack_1f0;
                iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_220);
                goto LAB_0013c5c3;
              }
              LVar11 = Link::getIndex(this);
              pIVar14 = Traversal::getParentJointFromLinkIndex(traversal,LVar11);
              LVar11 = Link::getIndex(this);
              pLVar10 = Traversal::getParentLinkFromLinkIndex(traversal,LVar11);
              LVar11 = Link::getIndex(pLVar10);
              LVar15 = Link::getIndex(this);
              iVar7 = (*pIVar14->_vptr_IJoint[10])(pIVar14,jointPos,LVar11,LVar15);
              iDynTree::Transform::Transform
                        ((Transform *)local_1b8,(Transform *)CONCAT44(extraout_var_01,iVar7));
              iDynTree::Transform::operator*(local_98,(SpatialForceVector *)local_1b8);
              local_1f8 = local_70;
              dStack_1f0 = dStack_68;
              local_220._24_8_ = local_80;
              local_220._32_8_ = dStack_78;
              local_220._8_8_ = local_90;
              local_220._16_8_ = dStack_88;
              iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_98);
              LVar11 = Link::getIndex(this);
              this = Traversal::getParentLinkFromLinkIndex(traversal,LVar11);
              LVar11 = Link::getIndex(this);
              pIVar14 = Traversal::getParentJointFromLinkIndex(traversal,LVar11);
              LVar11 = Link::getIndex(this);
              pLVar10 = Traversal::getParentLinkFromLinkIndex(traversal,LVar11);
              LVar11 = Link::getIndex(pLVar10);
              iVar7 = (*pIVar14->_vptr_IJoint[4])(pIVar14);
            } while (iVar7 != 1);
            LVar15 = Link::getIndex(this);
            (*pIVar14->_vptr_IJoint[0xc])(local_1b8,pIVar14,0,LVar15,LVar11);
            iVar7 = (*pIVar14->_vptr_IJoint[0x18])(pIVar14);
            dVar2 = (double)iDynTree::GeomVector3::dot((GeomVector3 *)local_1b8);
            dVar3 = (double)iDynTree::GeomVector3::dot((GeomVector3 *)(local_1b8[0].m_mcom + 2));
            pdVar17 = (double *)iDynTree::MatrixDynSize::operator()((ulong)massMatrix,uVar20);
            *pdVar17 = dVar2 + dVar3;
            pdVar17 = (double *)iDynTree::MatrixDynSize::operator()((ulong)massMatrix,uVar20);
            dVar2 = *pdVar17;
            pdVar17 = (double *)
                      iDynTree::MatrixDynSize::operator()
                                ((ulong)massMatrix,CONCAT44(extraout_var_02,iVar7) + 6);
          } while( true );
        }
      }
LAB_0013c5c3:
      bVar1 = 0 < (long)uVar19;
      uVar19 = uVar19 - 1;
    } while (bVar1);
  }
  pLVar10 = Traversal::getLink(traversal,0);
  LVar11 = Link::getIndex(pLVar10);
  LinkInertias::operator()(linkCRBs,LVar11);
  iDynTree::SpatialInertia::asMatrix();
  puVar18 = (undefined8 *)(lVar8 + 0x20);
  lVar8 = 0x20;
  do {
    uVar5 = *(undefined8 *)((long)adStack_1d8 + lVar8 + 8);
    puVar18[-4] = *(undefined8 *)((long)adStack_1d8 + lVar8);
    puVar18[-3] = uVar5;
    uVar5 = *(undefined8 *)((long)adStack_1d8 + lVar8 + 0x18);
    puVar18[-2] = *(undefined8 *)((long)adStack_1d8 + lVar8 + 0x10);
    puVar18[-1] = uVar5;
    uVar5 = *(undefined8 *)((long)local_1b8[0].m_mcom + lVar8);
    *puVar18 = *(undefined8 *)((long)local_1b8[0].m_mcom + lVar8 + -8);
    puVar18[1] = uVar5;
    lVar8 = lVar8 + 0x30;
    puVar18 = puVar18 + lVar9;
  } while (lVar8 != 0x140);
  return true;
}

Assistant:

bool CompositeRigidBodyAlgorithm(const Model& model,
                                 const Traversal& traversal,
                                 const JointPosDoubleArray& jointPos,
                                 LinkCompositeRigidBodyInertias& linkCRBs,
                                 FreeFloatingMassMatrix& massMatrix)
{
    // Map the massMatrix to an Eigen matrix
    Eigen::Map<Eigen::Matrix<double,Eigen::Dynamic,Eigen::Dynamic,Eigen::RowMajor> >
        massMatrixEigen(massMatrix.data(),massMatrix.rows(),massMatrix.cols());

    /**
     * Forward pass: initialize the CRBI
     * of each link to its own inertia.
     */
    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex visitedLinkIndex = visitedLink->getIndex();
        linkCRBs(visitedLinkIndex) = visitedLink->getInertia();
    }

    /**
     * Backward pass: for each link compute the
     * CRB of the link (given the traversal).
     */
    for(int traversalEl = traversal.getNrOfVisitedLinks()-1; traversalEl >= 0; traversalEl--)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex    visitedLinkIndex = visitedLink->getIndex();
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

        // If the visited link is not the base one, add its
        // CRBI to the CRBI of the parent
        // \todo TODO streamline the check "is Link the floating base"
        // given a traversal
        if( parentLink )
        {
            LinkIndex parentLinkIndex = parentLink->getIndex();

            linkCRBs(parentLinkIndex) = linkCRBs(parentLinkIndex) +
                (toParentJoint->getTransform(jointPos,parentLinkIndex,visitedLinkIndex))*linkCRBs(visitedLinkIndex);

            // For now we just implement the CRBA for 0 or 1 dofs joints.
            assert( toParentJoint->getNrOfDOFs() <= 1 );

            // If the visited link is attached to its parent with a fixed joint,
            // we don't need to do anything else for this link.
            // Otherwise we need to compute the rows and columns of the mass matrix
            // related to the dof connecting the visited link to its parent
            if( toParentJoint->getNrOfDOFs() == 1 )
            {
                // In this loop we follow the algorith as described in
                // in Featherstone 2008 , Table 6.2 . In particular S_visitedDof (S_i in the book)
                // is the motion subspace vector connected to the degree of freedom connecting the link to its parent,
                // while S_ancestorDof (S_j in the book) is the motion subspace vector of its ancestor considered in the
                // inner loop
                SpatialMotionVector S_visitedDof = toParentJoint->getMotionSubspaceVector(0,visitedLink->getIndex(),parentLinkIndex);
                SpatialForceVector  F = linkCRBs(visitedLinkIndex)*S_visitedDof;

                // We compute the term of the mass matrix on the diagonal
                // (in the book: H_ii = S_i^\top F
                size_t dofIndex = toParentJoint->getDOFsOffset();
                massMatrix(6+dofIndex,6+dofIndex) = S_visitedDof.dot(F);

                // Then we compute all the off-diagonal terms relative to
                // the ancestors of the currently visited link

                // j = i
                LinkConstPtr ancestor = visitedLink;

                // while lambda(j) != 0
                while( traversal.getParentLinkFromLinkIndex(traversal.getParentLinkFromLinkIndex(ancestor->getIndex())->getIndex()) )
                {
                    {
                        IJointConstPtr ancestorToParentJoint = traversal.getParentJointFromLinkIndex(ancestor->getIndex());
                        LinkIndex      ancestorParent =        traversal.getParentLinkFromLinkIndex(ancestor->getIndex())->getIndex();
                        Transform ancestorParent_X_ancestor = ancestorToParentJoint->getTransform(jointPos,ancestorParent,ancestor->getIndex());
                        F = ancestorParent_X_ancestor*F;
                    }

                    // j = \lambda(j)

                    ancestor = traversal.getParentLinkFromLinkIndex(ancestor->getIndex());

                    IJointConstPtr ancestorToParentJoint = traversal.getParentJointFromLinkIndex(ancestor->getIndex());
                    LinkIndex      ancestorParentIndex   = traversal.getParentLinkFromLinkIndex(ancestor->getIndex())->getIndex();

                    // For now we just implement the CRBA for 0 or 1 dofs joints.
                    assert( ancestorToParentJoint->getNrOfDOFs() <= 1 );

                    if( ancestorToParentJoint->getNrOfDOFs() == 1 )
                    {
                        SpatialMotionVector S_ancestorDof =
                            ancestorToParentJoint->getMotionSubspaceVector(0,ancestor->getIndex(),ancestorParentIndex);
                        size_t ancestorDofIndex = ancestorToParentJoint->getDOFsOffset();

                        // H_ij = F^\top S_j
                        // H_ji = H_ij^\top
                        massMatrix(6+dofIndex,6+ancestorDofIndex) = S_ancestorDof.dot(F);
                        massMatrix(6+ancestorDofIndex,6+dofIndex) = massMatrix(6+dofIndex,6+ancestorDofIndex);
                    }
                }

                // We need to write F in the base link for the off-diagonal term of the mass matrix
                {
                    IJointConstPtr ancestorToParentJoint = traversal.getParentJointFromLinkIndex(ancestor->getIndex());
                    LinkIndex      ancestorParent =        traversal.getParentLinkFromLinkIndex(ancestor->getIndex())->getIndex();
                    Transform ancestorParent_X_ancestor = ancestorToParentJoint->getTransform(jointPos,ancestorParent,ancestor->getIndex());
                    F = ancestorParent_X_ancestor*F;
                }

                // Fill the 6 \times nDof right top submatrix of the mass matrix
                // (i.e. the jacobian of the momentum)
                Eigen::Matrix<double,6,1> FEigen = toEigen(F);
                massMatrixEigen.block<6,1>(0,6+dofIndex) = FEigen;
                massMatrixEigen.block<1,6>(6+dofIndex,0) = FEigen;
            }

        }
    }

    // Fill the top left 6x6 matrix: it is just the composite rigid body inertia of all the body
    Matrix6x6 lockedInertia = linkCRBs(traversal.getLink(0)->getIndex()).asMatrix();
    massMatrixEigen.block<6,6>(0,0) = toEigen(lockedInertia);

    return true;
}